

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_writer.cc
# Opt level: O0

void __thiscall SettingsWriter::SettingsWriter(SettingsWriter *this)

{
  SettingsWriter *this_local;
  
  std::__cxx11::string::string((string *)this);
  bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::StackAllocated(&this->cbb_)
  ;
  return;
}

Assistant:

SettingsWriter::SettingsWriter() {}